

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O2

clock_variables_t *
tchecker::clock_variables
          (clock_variables_t *__return_storage_ptr__,reference_clock_variables_t *refclocks,
          clock_variables_t *clocks)

{
  pointer bg;
  string *name;
  reference ppVar1;
  clock_info_t *pcVar2;
  clock_id_t id;
  uint id_00;
  pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar3;
  index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  const_key_map_iterator_t __begin1;
  
  memset(__return_storage_ptr__,0,0xa0);
  for (id_00 = 0; id_00 < refclocks->_refcount; id_00 = id_00 + 1) {
    name = variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::name((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)refclocks,id_00);
    clock_variables_t::declare(__return_storage_ptr__,name,1);
  }
  __begin1.m_ptr =
       *(pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         **)&(clocks->
             super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).
             super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._index._key_map.m_flat_tree.m_data;
  ppVar3 = __begin1.m_ptr +
           *(stored_size_type *)
            ((long)&(clocks->
                    super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).
                    super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._index._key_map.m_flat_tree.m_data + 8);
  while (__begin1.m_ptr != ppVar3) {
    ppVar1 = boost::container::
             vec_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
             ::operator*(&__begin1);
    pcVar2 = variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::info((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)clocks,ppVar1->first);
    clock_variables_t::declare
              (__return_storage_ptr__,&ppVar1->second,(pcVar2->super_size_info_t)._size);
    boost::container::
    vec_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
    ::operator++(&__begin1);
  }
  return __return_storage_ptr__;
}

Assistant:

tchecker::clock_variables_t clock_variables(tchecker::reference_clock_variables_t const & refclocks,
                                            tchecker::clock_variables_t const & clocks)
{
  tchecker::clock_variables_t clockvars;

  // declare reference clocks
  for (tchecker::clock_id_t id = 0; id < refclocks.refcount(); ++id)
    clockvars.declare(refclocks.name(id), 1);

  // declare clocks
  for (auto && [id, name] : clocks.index())
    clockvars.declare(name, clocks.info(id).size());

  return clockvars;
}